

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  ImGuiPopupData *pIVar2;
  ImGuiWindow *pIVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  if ((long)(int)uVar1 != 0) {
    uVar4 = 0;
    if (ref_window == (ImGuiWindow *)0x0) {
LAB_00146d1e:
      if ((int)uVar4 < (int)uVar1) {
        ClosePopupToLevel((int)uVar4,restore_focus_to_window_under_popup);
        return;
      }
    }
    else {
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      lVar6 = 8;
      for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
        pIVar2 = (GImGui->OpenPopupStack).Data;
        pIVar3 = pIVar2[uVar4].Window;
        if ((pIVar3 != (ImGuiWindow *)0x0) && ((pIVar3->Flags & 0x1000000) == 0)) {
          plVar7 = (long *)((long)&pIVar2->PopupId + lVar6);
          bVar9 = false;
          uVar8 = uVar4;
          while (((long)uVar8 < (long)(int)uVar1 && (!bVar9))) {
            if (*plVar7 == 0) {
              bVar9 = false;
            }
            else {
              bVar9 = *(ImGuiWindow **)(*plVar7 + 0x3b0) == ref_window->RootWindow;
            }
            uVar8 = uVar8 + 1;
            plVar7 = plVar7 + 6;
          }
          if (!bVar9) goto LAB_00146d1e;
        }
        lVar6 = lVar6 + 0x30;
      }
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack when popups are not direct descendant of the reference window (the reference window is often the NavWindow)
            bool popup_or_descendent_is_ref_window = false;
            for (int m = popup_count_to_keep; m < g.OpenPopupStack.Size && !popup_or_descendent_is_ref_window; m++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[m].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                        popup_or_descendent_is_ref_window = true;
            if (!popup_or_descendent_is_ref_window)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        //IMGUI_DEBUG_LOG("ClosePopupsOverWindow(%s) -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}